

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
populate_initial_block_list
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          size_t blockCount)

{
  Block *pBVar1;
  bool *pbVar2;
  size_t sVar3;
  
  this->initialBlockPoolSize = blockCount;
  if (blockCount == 0) {
    this->initialBlockPool = (Block *)0x0;
  }
  else {
    pBVar1 = (Block *)malloc(blockCount * 0xd0);
    if (pBVar1 == (Block *)0x0) {
      pBVar1 = (Block *)0x0;
    }
    else {
      pbVar2 = &pBVar1->dynamicallyAllocated;
      do {
        (((atomic<unsigned_int> *)(pbVar2 + -0x11))->super___atomic_base<unsigned_int>)._M_i = 0;
        (((atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
           *)(pbVar2 + -9))->_M_b)._M_p = (__pointer_type)0x0;
        *(undefined2 *)(pbVar2 + -1) = 0x100;
        *(Block **)(pbVar2 + -0x41) = (Block *)0x0;
        (((atomic<unsigned_long> *)(pbVar2 + -0x39))->super___atomic_base<unsigned_long>)._M_i = 0;
        pbVar2 = pbVar2 + 0xd0;
        blockCount = blockCount - 1;
      } while (blockCount != 0);
    }
    this->initialBlockPool = pBVar1;
    if (pBVar1 == (Block *)0x0) {
      this->initialBlockPoolSize = 0;
    }
    sVar3 = this->initialBlockPoolSize;
    if (sVar3 != 0) {
      pbVar2 = &pBVar1->dynamicallyAllocated;
      do {
        *pbVar2 = false;
        pbVar2 = pbVar2 + 0xd0;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount)
	{
		initialBlockPoolSize = blockCount;
		if (initialBlockPoolSize == 0) {
			initialBlockPool = nullptr;
			return;
		}
		
		initialBlockPool = create_array<Block>(blockCount);
		if (initialBlockPool == nullptr) {
			initialBlockPoolSize = 0;
		}
		for (size_t i = 0; i < initialBlockPoolSize; ++i) {
			initialBlockPool[i].dynamicallyAllocated = false;
		}
	}